

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tickcounter_linux.c
# Opt level: O0

TICK_COUNTER_HANDLE tickcounter_create(void)

{
  int64_t iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  TICK_COUNTER_INSTANCE *result;
  
  l = (LOGGER_LOG)malloc(0x10);
  if (l != (LOGGER_LOG)0x0) {
    set_time_basis();
    iVar1 = get_time_ms();
    *(int64_t *)l = iVar1;
    if (*(long *)l == -1) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/adapters/tickcounter_linux.c"
                  ,"tickcounter_create",0x1d,1,"tickcounter failed: time return INVALID_TIME.");
      }
      free(l);
      l = (LOGGER_LOG)0x0;
    }
    else {
      *(long *)(l + 8) = 0;
    }
  }
  return (TICK_COUNTER_HANDLE)l;
}

Assistant:

TICK_COUNTER_HANDLE tickcounter_create(void)
{
    TICK_COUNTER_INSTANCE* result = (TICK_COUNTER_INSTANCE*)malloc(sizeof(TICK_COUNTER_INSTANCE));
    if (result != NULL)
    {
        set_time_basis();

        result->init_time_value = get_time_ms();
        if (result->init_time_value == INVALID_TIME_VALUE)
        {
            LogError("tickcounter failed: time return INVALID_TIME.");
            free(result);
            result = NULL;
        }
        else
        {
            result->current_ms = 0;
        }
    }
    return result;
}